

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O3

void __thiscall ast::Dir_equ::Dir_equ(Dir_equ *this,Symbol *symbol,Expression *value,Location left)

{
  uint uVar1;
  pointer pcVar2;
  iterator iVar3;
  long *plVar4;
  mapped_type *ppSVar5;
  size_type *psVar6;
  long lVar7;
  string local_90;
  key_type local_70;
  undefined1 local_50 [32];
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  *(undefined4 *)&(this->super_Directive).super_Statement.location.unit = left.unit._0_4_;
  *(undefined4 *)((long)&(this->super_Directive).super_Statement.location.unit + 4) =
       left.unit._4_4_;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Statement_0013c9f8;
  this->symbol = symbol;
  lVar7 = Sections::current_section;
  uVar1 = *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_index = uVar1;
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar7 + 0x30);
  (this->super_Directive).super_Statement.size_in_memory = 0;
  symbol->section = uVar1;
  symbol->type = UNDEFINED;
  symbol->value_expression = value;
  pcVar2 = (symbol->name)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + (symbol->name)._M_string_length);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)Symbols::table_abi_cxx11_,&local_70);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = *(long *)((long)iVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_true>
                            ._M_cur + 0x28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (lVar7 == 0) {
    ppSVar5 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)Symbols::table_abi_cxx11_,&symbol->name);
    *ppSVar5 = symbol;
  }
  else {
    if (*(long *)(lVar7 + 0x40) == 0) {
      *(undefined4 *)(lVar7 + 0x3c) = *(undefined4 *)(Sections::current_section + 0x20);
      *(undefined4 *)(lVar7 + 0x38) = 2;
      *(Expression **)(lVar7 + 0x40) = value;
      pcVar2 = (symbol->name)._M_dataplus._M_p;
      local_50._0_8_ = symbol;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &(symbol->name).field_2) {
        operator_delete(pcVar2);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                     "Symbol \"",&symbol->name);
      plVar4 = (long *)std::__cxx11::string::append(local_50);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90.field_2._8_8_ = plVar4[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_90._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      error_report(&symbol->location,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((Symbol *)local_50._0_8_ == (Symbol *)(local_50 + 0x10)) {
        return;
      }
    }
    operator_delete((void *)local_50._0_8_);
  }
  return;
}

Assistant:

Dir_equ::Dir_equ(Symbol *symbol, Expression *value, Location left) :
	Directive {left}, symbol {symbol}
{
	section_index = Sections::current_section->number;	/* Um simbolo equ não pertence a uma secção ... */
	section_offset = Sections::current_section->content_size;
	size_in_memory = 0;
	symbol->set_properties(UNDEFINED, Sections::current_section->number, value);
	Symbol *s = Symbols::search(symbol->name);
	if (s == nullptr) {
		Symbols::add(symbol);
	}
	else if (s->value_expression == nullptr) {
		s->set_properties(UNDEFINED, Sections::current_section->number, value);
		delete symbol;
	}
	else
		error_report(&symbol->location, "Symbol \"" + symbol->name + "\" is already defined");
}